

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

void __thiscall lan::db_bit::~db_bit(db_bit *this)

{
  db_bit *this_00;
  ulong uVar1;
  db_bit local_60;
  db_bit *local_10;
  db_bit *this_local;
  
  local_10 = this;
  if (this->data == (void *)0x0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) goto LAB_0010ceb9;
  }
  free(this->data);
  db_bit(&local_60);
  ~db_bit(&local_60);
LAB_0010ceb9:
  if (this->lin != (db_bit *)0x0) {
    this_00 = this->lin;
    if (this_00 != (db_bit *)0x0) {
      ~db_bit(this_00);
      operator_delete(this_00,0x50);
    }
    this->lin = (db_bit *)0x0;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~ db_bit (){
            if(data or not key.empty()) { ::free(data) ; db_bit();}
            if(lin) {delete lin; lin = nullptr;}
        }